

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

uint stb_hash_fast(void *p,int len)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint hash;
  int iVar4;
  
  if (p == (void *)0x0 || len < 1) {
    return 0;
  }
  uVar3 = len;
  if (((ulong)p & 1) == 0) {
    iVar4 = len;
    if (3 < len) {
      do {
        uVar3 = (*p + uVar3) * 0x10000 ^
                ((uint)(byte)*(ushort *)((long)p + 2) << 0xb | (uint)*(byte *)((long)p + 3) << 0x13)
                ^ *p + uVar3;
        p = (void *)((long)p + 4);
        uVar3 = (uVar3 >> 0xb) + uVar3;
        len = iVar4 + -4;
        bVar1 = 7 < iVar4;
        iVar4 = len;
      } while (bVar1);
    }
  }
  else {
    iVar4 = len;
    if (3 < len) {
      do {
        uVar3 = (*p + uVar3) * 0x10000 ^
                ((uint)(byte)*(ushort *)((long)p + 2) << 0xb | (uint)*(byte *)((long)p + 3) << 0x13)
                ^ *p + uVar3;
        p = (void *)((long)p + 4);
        uVar3 = (uVar3 >> 0xb) + uVar3;
        len = iVar4 + -4;
        bVar1 = 7 < iVar4;
        iVar4 = len;
      } while (bVar1);
    }
  }
  if (len == 1) {
    uVar3 = uVar3 + (byte)*p;
    uVar2 = uVar3 * 0x400 ^ uVar3;
    uVar3 = uVar2 >> 1;
  }
  else {
    if (len == 2) {
      uVar3 = (*p + uVar3) * 0x800 ^ *p + uVar3;
      uVar3 = (uVar3 >> 0x11) + uVar3;
      goto LAB_001840d9;
    }
    if (len != 3) goto LAB_001840d9;
    uVar2 = (*p + uVar3) * 0x10000 ^ (uint)(byte)*(ushort *)((long)p + 2) << 0x12 ^ *p + uVar3;
    uVar3 = uVar2 >> 0xb;
  }
  uVar3 = uVar3 + uVar2;
LAB_001840d9:
  uVar3 = uVar3 * 8 ^ uVar3;
  uVar3 = (uVar3 >> 5) + uVar3;
  uVar3 = uVar3 * 0x10 ^ uVar3;
  uVar3 = (uVar3 >> 0x11) + uVar3;
  uVar3 = uVar3 * 0x2000000 ^ uVar3;
  return (uVar3 >> 6) + uVar3;
}

Assistant:

unsigned int stb_hash_fast(void *p, int len)
{
   unsigned char *q = (unsigned char *) p;
   unsigned int hash = len;

   if (len <= 0 || q == NULL) return 0;

   /* Main loop */
   if (((int) q & 1) == 0) {
      for (;len > 3; len -= 4) {
         unsigned int val;
         hash +=  stb__get16(q);
         val   = (stb__get16(q+2) << 11);
         hash  = (hash << 16) ^ hash ^ val;
         q    += 4;
         hash += hash >> 11;
      }
   } else {
      for (;len > 3; len -= 4) {
         unsigned int val;
         hash +=  stb__get16_slow(q);
         val   = (stb__get16_slow(q+2) << 11);
         hash  = (hash << 16) ^ hash ^ val;
         q    += 4;
         hash += hash >> 11;
      }
   }

   /* Handle end cases */
   switch (len) {
      case 3: hash += stb__get16_slow(q);
              hash ^= hash << 16;
              hash ^= q[2] << 18;
              hash += hash >> 11;
              break;
      case 2: hash += stb__get16_slow(q);
              hash ^= hash << 11;
              hash += hash >> 17;
              break;
      case 1: hash += q[0];
              hash ^= hash << 10;
              hash += hash >> 1;
              break;
      case 0: break;
   }

   /* Force "avalanching" of final 127 bits */
   hash ^= hash << 3;
   hash += hash >> 5;
   hash ^= hash << 4;
   hash += hash >> 17;
   hash ^= hash << 25;
   hash += hash >> 6;

   return hash;
}